

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O0

void __thiscall helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_add_order *m)

{
  uint64_t id;
  order order;
  bool bVar1;
  side_type side_00;
  __uint32_t _Var2;
  __uint32_t _Var3;
  pointer ppVar4;
  uint64_t timestamp_00;
  long in_RSI;
  order o;
  uint64_t timestamp;
  side_type side;
  uint32_t quantity;
  uint64_t price;
  uint64_t order_id;
  order_book *ob;
  iterator it;
  unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
  *in_stack_fffffffffffffeb8;
  char in_stack_ffffffffffffff46;
  undefined8 in_stack_ffffffffffffff78;
  event *in_stack_ffffffffffffff80;
  order_book *in_stack_ffffffffffffff88;
  order_book *local_70;
  uint64_t uStack_68;
  string *local_60;
  uint64_t uStack_58;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_28;
  ulong local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_18;
  long local_10;
  
  local_20 = (ulong)*(ushort *)(in_RSI + 1);
  local_10 = in_RSI;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::find(in_stack_fffffffffffffeb8,(key_type *)0x140aa9);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::end(in_stack_fffffffffffffeb8);
  bVar1 = std::__detail::operator!=(&local_18,&local_28);
  if (bVar1) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>
                         *)0x140af2);
    id = *(uint64_t *)(local_10 + 0xb);
    _Var2 = __bswap_32(*(__uint32_t *)(local_10 + 0x20));
    _Var3 = __bswap_32(*(__uint32_t *)(local_10 + 0x14));
    side_00 = itch50_side(in_stack_ffffffffffffff46);
    timestamp_00 = itch50_timestamp(0x140b78);
    helix::order::order((order *)&stack0xffffffffffffff80,id,(ulong)_Var2,(ulong)_Var3,side_00,
                        timestamp_00);
    order.id = (uint64_t)local_60;
    order.level = (price_level *)uStack_68;
    order.price = uStack_58;
    order.quantity = in_stack_ffffffffffffff78;
    order._32_8_ = in_stack_ffffffffffffff80;
    order.timestamp = (uint64_t)in_stack_ffffffffffffff88;
    order_book::add(in_stack_ffffffffffffff88,order);
    order_book::set_timestamp(&ppVar4->second,timestamp_00);
    order_book::symbol_abi_cxx11_(&ppVar4->second);
    make_ob_event(local_60,uStack_68,local_70,(event_mask)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                 );
    std::function<void_(const_helix::event_&)>::operator()
              ((function<void_(const_helix::event_&)> *)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
    event::~event((event *)0x140c7c);
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_add_order* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;

        uint64_t order_id = m->OrderReferenceNumber;
        uint64_t price    = be32toh(m->Price);
        uint32_t quantity = be32toh(m->Shares);
        auto     side     = itch50_side(m->BuySellIndicator);
        uint64_t timestamp = itch50_timestamp(m->Timestamp);
        order o{order_id, price, quantity, side, timestamp};
        ob.add(std::move(o));
        ob.set_timestamp(timestamp);
        _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
    }
}